

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::errors<char[38],char[9],char[4],char[7],char[94]>
            (char (*args) [38],char (*args_1) [9],char (*args_2) [4],char (*args_3) [7],
            char (*args_4) [94])

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *this;
  char *in_R8;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  allocator_type *in_stack_fffffffffffffd08;
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  iterator pbVar2;
  undefined1 *puVar3;
  undefined1 local_25b [3];
  string local_258 [32];
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  string local_160 [55];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string *local_e8;
  string local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  string *local_40;
  undefined8 local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  
  local_25b[1] = 1;
  local_e8 = local_e0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,in_RSI,&local_129);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  local_e8 = (string *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,local_18,&local_181);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  local_e8 = (string *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,local_20,&local_1c9);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  local_e8 = (string *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,local_28,&local_211);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  puVar3 = local_60;
  local_e8 = (string *)puVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,local_30,(allocator *)(local_25b + 2));
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  local_25b[1] = 0;
  local_40 = local_e0;
  local_38 = 5;
  pbVar2 = (iterator)local_25b;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x116e8e);
  __l._M_len = (size_type)puVar3;
  __l._M_array = pbVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffd10,__l,in_stack_fffffffffffffd08);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x116ebf);
  psVar1 = local_e0;
  this = (string *)&local_40;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar1);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)(local_25b + 2));
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  return in_RDI;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}